

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall FIX::SocketAcceptor::onWrite(SocketAcceptor *this)

{
  socket_handle in_EDX;
  SocketServer *in_RSI;
  
  onWrite((SocketAcceptor *)
          ((long)&this[-1].super_Acceptor.m_settings.m_settings._M_t._M_impl.super__Rb_tree_header.
                  _M_header + 0x18),in_RSI,in_EDX);
  return;
}

Assistant:

void SocketAcceptor::onWrite(SocketServer &server, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;
  if (pSocketConnection->processQueue()) {
    pSocketConnection->unsignal();
  }
}